

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfile.hh
# Opt level: O3

void __thiscall
helix::nasdaq::binaryfile_session<helix::nasdaq::itch50_handler>::register_callback
          (binaryfile_session<helix::nasdaq::itch50_handler> *this,event_callback *callback)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<void_(const_helix::event_&)>::function
            ((function<void_(const_helix::event_&)> *)&local_30,callback);
  itch50_handler::register_callback(&this->_handler,(event_callback *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void binaryfile_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}